

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsLoadSignalHandlerCallback(_func_HelicsBool_int *handler,HelicsBool useSeparateThread)

{
  int in_ESI;
  long in_RDI;
  
  (anonymous_namespace)::keyHandler = in_RDI;
  if (in_RDI == 0) {
    if (in_ESI == 0) {
      helicsLoadSignalHandler();
    }
    else {
      helicsLoadThreadedSignalHandler();
    }
  }
  else if (in_ESI == 0) {
    signal(2,anon_unknown.dwarf_1a6d0::signalHandlerCallback);
  }
  else {
    signal(2,anon_unknown.dwarf_1a6d0::signalHandlerThreadedCallback);
  }
  return;
}

Assistant:

void helicsLoadSignalHandlerCallback(HelicsBool (*handler)(int), HelicsBool useSeparateThread)
{
    keyHandler = handler;
    if (handler != nullptr) {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedCallback));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerCallback));
        }

    } else {
        if (useSeparateThread != HELICS_FALSE) {
            helicsLoadThreadedSignalHandler();
        } else {
            helicsLoadSignalHandler();
        }
    }
}